

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtendAlign.h
# Opt level: O2

int __thiscall
ExtendAlign<DNA>::Extend
          (ExtendAlign<DNA> *this,Sequence<DNA> *A,Sequence<DNA> *B,size_t *bestA,size_t *bestB,
          Cigar *cigar,AlignmentDirection dir,size_t startA,size_t startB)

{
  pointer pCVar1;
  Sequence<DNA> *this_00;
  Sequence<DNA> *this_01;
  deque<CigarEntry,_std::allocator<CigarEntry>_> *this_02;
  char cVar2;
  char cVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  size_t sVar8;
  pointer pCVar9;
  int iVar10;
  CigarOp CVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  size_t sVar15;
  CigarOp CVar16;
  uint uVar17;
  ulong uVar18;
  int iVar19;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double dVar25;
  undefined1 local_118 [8];
  CigarOp op;
  size_t local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  ulong local_e0;
  size_t local_d8;
  Sequence<DNA> *local_d0;
  Sequence<DNA> *local_c8;
  long local_c0;
  long local_b8;
  deque<CigarEntry,_std::allocator<CigarEntry>_> *local_b0;
  size_t local_a8;
  ulong local_a0;
  size_t *local_98;
  CigarOps *local_90;
  ulong local_88;
  int local_80;
  int local_7c;
  Cells *local_78;
  ulong local_70;
  size_t *local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ExtendAlign<DNA> *local_48;
  ulong local_40;
  int local_38;
  allocator_type local_32;
  byte local_31;
  
  sVar8 = (B->sequence)._M_string_length - startB;
  sVar15 = (A->sequence)._M_string_length - startA;
  if (dir != Forward) {
    sVar8 = startB;
    sVar15 = startA;
  }
  local_88 = sVar8 + 1;
  uVar22 = sVar15 + 1;
  local_78 = &this->mRow;
  local_d0 = B;
  local_c8 = A;
  local_98 = bestA;
  local_68 = bestB;
  local_50 = uVar22;
  local_48 = this;
  if ((ulong)((long)(this->mRow).
                    super__Vector_base<ExtendAlign<DNA>::Cell,_std::allocator<ExtendAlign<DNA>::Cell>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
              (long)(this->mRow).
                    super__Vector_base<ExtendAlign<DNA>::Cell,_std::allocator<ExtendAlign<DNA>::Cell>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) < uVar22) {
    auVar23._8_4_ = (int)(uVar22 >> 0x20);
    auVar23._0_8_ = uVar22;
    auVar23._12_4_ = 0x45300000;
    dVar25 = ((auVar23._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar22) - 4503599627370496.0)) * 1.5;
    uVar22 = (ulong)dVar25;
    std::vector<ExtendAlign<DNA>::Cell,_std::allocator<ExtendAlign<DNA>::Cell>_>::vector
              ((vector<ExtendAlign<DNA>::Cell,_std::allocator<ExtendAlign<DNA>::Cell>_> *)local_118,
               (long)(dVar25 - 9.223372036854776e+18) & (long)uVar22 >> 0x3f | uVar22,&local_32);
    std::vector<ExtendAlign<DNA>::Cell,_std::allocator<ExtendAlign<DNA>::Cell>_>::_M_move_assign
              (local_78,(_Vector_base<ExtendAlign<DNA>::Cell,_std::allocator<ExtendAlign<DNA>::Cell>_>
                         *)local_118);
    uVar22 = local_50;
    std::_Vector_base<ExtendAlign<DNA>::Cell,_std::allocator<ExtendAlign<DNA>::Cell>_>::
    ~_Vector_base((_Vector_base<ExtendAlign<DNA>::Cell,_std::allocator<ExtendAlign<DNA>::Cell>_> *)
                  local_118);
  }
  local_90 = &local_48->mOperations;
  uVar5 = local_88 * uVar22;
  if ((ulong)((long)(local_48->mOperations).super__Vector_base<CigarOp,_std::allocator<CigarOp>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage -
             (long)(local_48->mOperations).super__Vector_base<CigarOp,_std::allocator<CigarOp>_>.
                   _M_impl.super__Vector_impl_data._M_start) < uVar5) {
    auVar24._8_4_ = (int)(uVar5 >> 0x20);
    auVar24._0_8_ = uVar5;
    auVar24._12_4_ = 0x45300000;
    dVar25 = ((auVar24._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0)) * 1.5;
    uVar22 = (ulong)dVar25;
    std::vector<CigarOp,_std::allocator<CigarOp>_>::vector
              ((vector<CigarOp,_std::allocator<CigarOp>_> *)local_118,
               (long)(dVar25 - 9.223372036854776e+18) & (long)uVar22 >> 0x3f | uVar22,
               (allocator_type *)&local_32);
    std::vector<CigarOp,_std::allocator<CigarOp>_>::_M_move_assign
              (local_90,(_Vector_base<CigarOp,_std::allocator<CigarOp>_> *)local_118);
    uVar22 = local_50;
    std::_Vector_base<CigarOp,_std::allocator<CigarOp>_>::~_Vector_base
              ((_Vector_base<CigarOp,_std::allocator<CigarOp>_> *)local_118);
  }
  if (local_98 != (size_t *)0x0) {
    *local_98 = startA;
  }
  if (local_68 != (size_t *)0x0) {
    *local_68 = startB;
  }
  pCVar9 = (local_48->mRow).
           super__Vector_base<ExtendAlign<DNA>::Cell,_std::allocator<ExtendAlign<DNA>::Cell>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pCVar9->score = 0;
  iVar10 = (local_48->mAP).gapExtendScore;
  iVar12 = (local_48->mAP).gapOpenScore + iVar10;
  pCVar9->scoreGap = iVar12;
  iVar4 = (local_48->mAP).xDrop;
  pCVar1 = (local_48->mOperations).super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = 1;
  for (; (uVar5 < uVar22 && (SBORROW4(iVar12,-iVar4) == iVar12 + iVar4 < 0));
      iVar12 = iVar12 + iVar10) {
    pCVar1[uVar5] = Insertion;
    pCVar9[uVar5].score = iVar12;
    pCVar9[uVar5].scoreGap = -0x40000000;
    uVar5 = uVar5 + 1;
  }
  local_c0 = startA - 1;
  local_b8 = startB - 1;
  local_60 = 0;
  iVar10 = 0;
  local_58 = 0;
  uVar18 = 1;
  uVar7 = 0;
  local_b0 = &cigar->super_deque<CigarEntry,_std::allocator<CigarEntry>_>;
  local_70 = uVar22;
  for (; uVar18 < local_88; uVar18 = uVar18 + 1) {
    local_d8 = local_b8 + uVar18;
    if (dir != Forward) {
      local_d8 = startB - uVar18;
    }
    sVar15 = startA - local_58;
    uVar21 = 0xc0000000;
    iVar6 = -0x40000000;
    iVar12 = -0x40000000;
    local_a0 = local_58;
    uVar22 = local_58;
    local_e8 = uVar5;
    local_e0 = uVar18;
    local_40 = uVar7;
    while (this_01 = local_c8, uVar22 < local_e8) {
      pCVar9 = (local_78->
               super__Vector_base<ExtendAlign<DNA>::Cell,_std::allocator<ExtendAlign<DNA>::Cell>_>).
               _M_impl.super__Vector_impl_data._M_start;
      iVar20 = pCVar9[uVar22].scoreGap;
      local_100 = sVar15;
      local_f8 = uVar22;
      if (uVar22 == 0) {
        local_a8 = 0;
        sVar15 = 0;
      }
      else {
        sVar8 = uVar22 + local_c0;
        if (dir != Forward) {
          sVar8 = sVar15;
        }
        local_80 = iVar20;
        local_7c = iVar12;
        cVar2 = Sequence<DNA>::operator[](local_c8,sVar8);
        this_00 = local_d0;
        sVar15 = local_d8;
        local_f0 = uVar21;
        local_38 = iVar10;
        cVar3 = Sequence<DNA>::operator[](local_d0,local_d8);
        iVar20 = local_80;
        local_31 = '\0' < "\n  Metagenomics tool for the rest of us.\n\n  Usage:\n    nsearch search --query=<queryfile> --db=<databasefile>\n      --out=<outputfile> --min-identity=<minidentity> [--max-hits=<maxaccepts>] [--max-rejects=<maxrejects>] [--protein] [--strand=<strand>]\n    nsearch merge --forward=<forwardfile> --reverse=<reversefile> --out=<outputfile>\n    nsearch filter --in=<inputfile> --out=<outputfile> [--max-expected-errors=<maxee>]\n\n  Options:\n    --min-identity=<minidentity>    Minimum identity threshold (e.g. 0.8).\n    --max-hits=<maxaccepts>         Maximum number of successful hits reported for one query [default: 1].\n    --max-rejects=<maxrejects>      Abort after this many candidates were rejected [default: 16].\n    --max-expected-errors=<maxee>   Maximum number of expected errors [default: 1.0].\n    --strand=<strand>               Strand to search on (plus, minus or both). If minus (or both), queries are reverse complemented [default: both].\n"
                          [(long)cVar3 + (long)cVar2 * 0x1a + 0x205];
        local_a8 = sVar8;
        cVar2 = Sequence<DNA>::operator[](this_01,sVar8);
        uVar21 = local_f0;
        cVar3 = Sequence<DNA>::operator[](this_00,sVar15);
        iVar6 = local_7c +
                "\n  Metagenomics tool for the rest of us.\n\n  Usage:\n    nsearch search --query=<queryfile> --db=<databasefile>\n      --out=<outputfile> --min-identity=<minidentity> [--max-hits=<maxaccepts>] [--max-rejects=<maxrejects>] [--protein] [--strand=<strand>]\n    nsearch merge --forward=<forwardfile> --reverse=<reversefile> --out=<outputfile>\n    nsearch filter --in=<inputfile> --out=<outputfile> [--max-expected-errors=<maxee>]\n\n  Options:\n    --min-identity=<minidentity>    Minimum identity threshold (e.g. 0.8).\n    --max-hits=<maxaccepts>         Maximum number of successful hits reported for one query [default: 1].\n    --max-rejects=<maxrejects>      Abort after this many candidates were rejected [default: 16].\n    --max-expected-errors=<maxee>   Maximum number of expected errors [default: 1.0].\n    --strand=<strand>               Strand to search on (plus, minus or both). If minus (or both), queries are reverse complemented [default: both].\n"
                [(long)cVar3 + (long)cVar2 * 0x1a + 0x205];
        pCVar9 = (local_48->mRow).
                 super__Vector_base<ExtendAlign<DNA>::Cell,_std::allocator<ExtendAlign<DNA>::Cell>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar4 = (local_48->mAP).xDrop;
        uVar18 = local_e0;
        iVar10 = local_38;
      }
      iVar19 = (int)uVar21;
      iVar13 = iVar6;
      if (iVar6 <= iVar19) {
        iVar13 = iVar19;
      }
      iVar6 = iVar13;
      if (iVar13 <= iVar20) {
        iVar6 = iVar20;
      }
      iVar12 = pCVar9[local_f8].score;
      if (iVar4 < iVar10 - iVar6) {
        pCVar9[local_f8].score = -0x40000000;
        local_58 = local_58 + (local_f8 == local_58);
      }
      else {
        if (iVar10 < iVar6) {
          if (local_98 != (size_t *)0x0) {
            *local_98 = local_a8;
          }
          local_60 = local_f8;
          iVar10 = iVar6;
          local_40 = uVar18;
          if (local_68 != (size_t *)0x0) {
            *local_68 = sVar15;
          }
        }
        CVar16 = Match;
        if ((local_31 & 1) == 0) {
          CVar16 = Mismatch;
        }
        if (iVar13 <= iVar20) {
          CVar16 = Deletion;
        }
        CVar11 = Insertion;
        if (iVar6 != iVar19) {
          CVar11 = CVar16;
        }
        (local_48->mOperations).super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.
        super__Vector_impl_data._M_start[local_f8 + local_70] = CVar11;
        pCVar9[local_f8].score = iVar6;
        iVar13 = (local_48->mAP).gapExtendScore;
        uVar14 = (local_48->mAP).gapOpenScore + iVar6 + iVar13;
        uVar17 = uVar14;
        if ((int)uVar14 <= iVar20 + iVar13) {
          uVar17 = iVar20 + iVar13;
        }
        pCVar9[local_f8].scoreGap = uVar17;
        if ((int)uVar14 <= iVar13 + iVar19) {
          uVar14 = iVar13 + iVar19;
        }
        uVar21 = (ulong)uVar14;
        local_a0 = local_f8;
      }
      sVar15 = local_100 - 1;
      uVar22 = local_f8 + 1;
    }
    uVar7 = local_40;
    uVar22 = local_50;
    if (local_58 == local_e8) break;
    if (local_a0 < local_e8 - 1) {
      uVar5 = local_a0 + 1;
    }
    else {
      pCVar9 = (local_48->mRow).
               super__Vector_base<ExtendAlign<DNA>::Cell,_std::allocator<ExtendAlign<DNA>::Cell>_>.
               _M_impl.super__Vector_impl_data._M_start;
      iVar12 = (local_48->mAP).gapExtendScore;
      pCVar1 = (local_48->mOperations).super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl
               .super__Vector_impl_data._M_start;
      iVar6 = (local_48->mAP).gapOpenScore;
      for (uVar5 = local_e8; (iVar20 = (int)uVar21, iVar10 - iVar4 <= iVar20 && (uVar5 < local_50));
          uVar5 = uVar5 + 1) {
        pCVar9[uVar5].score = iVar20;
        pCVar9[uVar5].scoreGap = iVar6 + iVar12 + iVar20;
        pCVar1[uVar5 + local_70] = Insertion;
        uVar21 = (ulong)(uint)(iVar20 + iVar12);
      }
    }
    if (uVar5 < local_50) {
      pCVar9 = (local_78->
               super__Vector_base<ExtendAlign<DNA>::Cell,_std::allocator<ExtendAlign<DNA>::Cell>_>).
               _M_impl.super__Vector_impl_data._M_start + uVar5;
      pCVar9->score = -0x40000000;
      pCVar9->scoreGap = -0x40000000;
      uVar5 = uVar5 + 1;
    }
    local_70 = local_70 + local_50;
  }
  this_02 = local_b0;
  if (local_b0 != (deque<CigarEntry,_std::allocator<CigarEntry>_> *)0x0) {
    local_38 = iVar10;
    std::deque<CigarEntry,_std::allocator<CigarEntry>_>::clear(local_b0);
    uVar5 = local_60;
LAB_0017568b:
    iVar10 = local_38;
    if (uVar5 != 0 || uVar7 != 0) {
      local_118[0] = (local_90->super__Vector_base<CigarOp,_std::allocator<CigarOp>_>)._M_impl.
                     super__Vector_impl_data._M_start[uVar5 + uVar7 * uVar22];
      Cigar::Add((Cigar *)this_02,local_118);
      if (local_118[0] == Match) {
        uVar5 = uVar5 - 1;
      }
      else if (local_118[0] != Deletion) {
        if (local_118[0] != Mismatch) {
          if (local_118[0] == Insertion) {
            uVar5 = uVar5 - 1;
          }
          goto LAB_0017568b;
        }
        uVar5 = uVar5 - 1;
      }
      uVar7 = uVar7 - 1;
      goto LAB_0017568b;
    }
    if (dir == Forward) {
      Cigar::Reverse((Cigar *)this_02);
    }
  }
  return iVar10;
}

Assistant:

int Extend( const Sequence< Alphabet >& A, const Sequence< Alphabet >& B,
              size_t* bestA = NULL, size_t* bestB = NULL, Cigar* cigar = NULL,
              const AlignmentDirection dir = AlignmentDirection::Forward,
              size_t startA = 0, size_t startB = 0 ) {
    int    score;
    size_t x, y;
    size_t aIdx, bIdx;
    size_t bestX, bestY;

    size_t width, height;

    if( dir == AlignmentDirection::Forward ) {
      width  = A.Length() - startA + 1;
      height = B.Length() - startB + 1;
    } else {
      width  = startA + 1;
      height = startB + 1;
    }

    if( mRow.capacity() < width ) {
      // Enlarge vector
      mRow = Cells( width * 1.5 );
    }

    if( mOperations.capacity() < width * height ) {
      mOperations = CigarOps( width * height * 1.5 );
    }

    bestX = 0;
    bestY = 0;

    if( bestA )
      *bestA = startA;
    if( bestB )
      *bestB = startB;

    int bestScore      = 0;
    mRow[ 0 ].score    = 0;
    mRow[ 0 ].scoreGap = mAP.gapOpenScore + mAP.gapExtendScore;

    for( x = 1; x < width; x++ ) {
      score = mAP.gapOpenScore + x * mAP.gapExtendScore;

      if( score < -mAP.xDrop )
        break;

      mOperations[ x ]   = CigarOp::Insertion;
      mRow[ x ].score    = score;
      mRow[ x ].scoreGap = MinInt();
    }
    size_t rowSize = x;
    /* Print( mRow ); */

    size_t firstX = 0;

    for( y = 1; y < height; y++ ) {

      int rowGap    = MinInt();
      int score     = MinInt();
      int diagScore = MinInt();

      size_t lastX = firstX;

      for( x = firstX; x < rowSize; x++ ) {
        int colGap = mRow[ x ].scoreGap;

        aIdx = 0;
        bIdx = 0;
        bool match;
        if( x > 0 ) {
          // diagScore: score at col-1, row-1

          if( dir == AlignmentDirection::Forward ) {
            aIdx = startA + x - 1;
            bIdx = startB + y - 1;
          } else {
            aIdx = startA - x;
            bIdx = startB - y;
          }

          /* printf( "x:%zu y:%zu %c == %c\n", x, y, A[ aIdx ], B[ bIdx ] ); */
          match = MatchPolicy< Alphabet >::Match( A[ aIdx ], B[ bIdx ] );
          score = diagScore + ScorePolicy< Alphabet >::Score( A[ aIdx ], B[ bIdx ] );
        }

        // select highest score
        //  - coming from diag (current),
        //  - coming from left (row)
        //  - coming from top (col)
        if( score < rowGap )
          score = rowGap;
        if( score < colGap )
          score = colGap;

        // mRow[ x ] right now points to the previous row, so use this
        // in the next iteration for the diagonal computation of (x, y )
        diagScore = mRow[ x ].score;

        if( bestScore - score > mAP.xDrop ) {
          // X-Drop test failed
          mRow[ x ].score = MinInt();

          if( x == firstX ) {
            // Tighten left bound
            firstX++;
          }
        } else {
          lastX = x;

          // Check if we achieved new highscore
          if( score > bestScore ) {
            bestScore = score;

            if( bestA )
              *bestA = aIdx;
            if( bestB )
              *bestB = bIdx;

            bestX = x;
            bestY = y;
          }

          // Record new score
          CigarOp op;
          if( score == rowGap ) {
            op = CigarOp::Insertion;
          } else if( score == colGap ) {
            op = CigarOp::Deletion;
          } else {
            op = match ? CigarOp::Match : CigarOp::Mismatch;
          }
          mOperations[ y * width + x ] = op;

          mRow[ x ].score = score;
          mRow[ x ].scoreGap =
            std::max( score + mAP.gapOpenScore + mAP.gapExtendScore,
                      colGap + mAP.gapExtendScore );
          rowGap = std::max( score + mAP.gapOpenScore + mAP.gapExtendScore,
                             rowGap + mAP.gapExtendScore );
        }
      }

      if( firstX == rowSize ) {
        // All cells failed the X-Drop test
        // We are done 8)
        break;
      }

      if( lastX < rowSize - 1 ) {
        // Tighten right bound
        rowSize = lastX + 1;
      } else {
        // Extend row, since last checked column didn't fail X-Drop test
        while( rowGap >= ( bestScore - mAP.xDrop ) && rowSize < width ) {
          mRow[ rowSize ].score = rowGap;
          mRow[ rowSize ].scoreGap =
            rowGap + mAP.gapOpenScore + mAP.gapExtendScore;
          mOperations[ y * width + rowSize ] = CigarOp::Insertion;
          rowGap += mAP.gapExtendScore;
          rowSize++;
        }
      }

      // Properly reset right bound
      if( rowSize < width ) {
        mRow[ rowSize ].score    = MinInt();
        mRow[ rowSize ].scoreGap = MinInt();
        rowSize++;
      }
      /* Print( mRow ); */
    }

    if( cigar ) {
      size_t bx = bestX;
      size_t by = bestY;

      CigarEntry ce;
      cigar->Clear();
      while( bx != 0 || by != 0 ) {
        CigarOp op = mOperations[ by * width + bx ];
        cigar->Add( op );

        switch( op ) {
          case CigarOp::Insertion:
            bx--;
            break;
          case CigarOp::Deletion:
            by--;
            break;
          case CigarOp::Match:
            bx--;
            by--;
            break;
          case CigarOp::Mismatch:
            bx--;
            by--;
            break;
          default:
            assert( true );
            break;
        }
      }

      if( dir == AlignmentDirection::Forward ) {
        cigar->Reverse();
      }
    }

    return bestScore;
  }